

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.cpp
# Opt level: O0

pair<bool,_unsigned_long>
celero::RunAndCatchExc
          (TestFixture *test,uint64_t threads,uint64_t calls,
          shared_ptr<celero::TestFixture::ExperimentValue> *experimentValue)

{
  shared_ptr<celero::TestFixture::ExperimentValue> *calls_00;
  uint64_t threads_00;
  uint64_t test_00;
  bool bVar1;
  undefined8 extraout_RAX;
  element_type *peVar2;
  pair<bool,_unsigned_long> pVar3;
  pair<bool,_unsigned_long> pVar4;
  unsigned_long local_80;
  bool local_71 [25];
  exception *e;
  shared_ptr<celero::TestFixture::ExperimentValue> local_48;
  shared_ptr<celero::TestFixture::ExperimentValue> *local_38;
  shared_ptr<celero::TestFixture::ExperimentValue> *experimentValue_local;
  uint64_t calls_local;
  uint64_t threads_local;
  TestFixture *test_local;
  unsigned_long local_10;
  
  local_38 = experimentValue;
  experimentValue_local = (shared_ptr<celero::TestFixture::ExperimentValue> *)calls;
  calls_local = threads;
  threads_local = (uint64_t)test;
  bVar1 = ExceptionSettings::GetCatchExceptions();
  test_00 = threads_local;
  threads_00 = calls_local;
  calls_00 = experimentValue_local;
  if (bVar1) {
    std::shared_ptr<celero::TestFixture::ExperimentValue>::shared_ptr(&local_48,experimentValue);
    pVar3 = RunAndCatchSEHExc((TestFixture *)test_00,threads_00,(uint64_t)calls_00,&local_48);
    local_10 = pVar3.second;
    test_local._0_1_ = pVar3.first;
    std::shared_ptr<celero::TestFixture::ExperimentValue>::~shared_ptr(&local_48);
    pVar3.second = local_10;
    pVar3._0_8_ = extraout_RAX;
  }
  else {
    local_71[0] = true;
    peVar2 = std::__shared_ptr<celero::TestFixture::ExperimentValue,_(__gnu_cxx::_Lock_policy)2>::
             get(&experimentValue->
                  super___shared_ptr<celero::TestFixture::ExperimentValue,_(__gnu_cxx::_Lock_policy)2>
                );
    local_80 = (**(code **)(*(long *)test_00 + 0x40))(test_00,threads_00,calls_00,peVar2);
    pVar3 = std::make_pair<bool,unsigned_long>(local_71,&local_80);
    test_local._0_1_ = pVar3.first;
  }
  local_10 = pVar3.second;
  pVar4._1_7_ = pVar3._1_7_;
  pVar4.first = (bool)test_local._0_1_;
  pVar4.second = local_10;
  return pVar4;
}

Assistant:

std::pair<bool, uint64_t> RunAndCatchExc(TestFixture& test, uint64_t threads, uint64_t calls,
											 std::shared_ptr<celero::TestFixture::ExperimentValue> experimentValue)
	{
		if(ExceptionSettings::GetCatchExceptions() == true)
		{
#if CELERO_HAS_EXCEPTIONS
			try
			{
				return RunAndCatchSEHExc(test, threads, calls, experimentValue);
			}
			catch(const std::exception& e)
			{
				celero::console::SetConsoleColor(celero::console::ConsoleColor::Red);
				std::cout << "C++ exception \"" << e.what() << "\"" << std::endl;
				celero::console::SetConsoleColor(celero::console::ConsoleColor::Default);
			}
			catch(...)
			{
				celero::console::SetConsoleColor(celero::console::ConsoleColor::Red);
				std::cout << "Unknown C++ exception" << std::endl;
				celero::console::SetConsoleColor(celero::console::ConsoleColor::Default);
			}

			return std::make_pair(false, 0);
#else  // CELERO_HAS_EXCEPTIONS
			return RunAndCatchSEHExc(test, threads, calls, experimentValue.get());
#endif // CELERO_HAS_EXCEPTIONS
		}
		else
		{
			return std::make_pair(true, test.run(threads, calls, experimentValue.get()));
		}
	}